

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atf-c-leakcheck.h
# Opt level: O3

void init_fd_checking(void)

{
  int iVar1;
  char *pcVar2;
  undefined8 uVar3;
  int fds_2 [2];
  int fds_1 [2];
  int local_10;
  int local_c;
  int local_8;
  int local_4;
  
  iVar1 = pipe2(&local_8,0x80000);
  if (iVar1 == 0) {
    fd_leak_test_a = local_8;
    fd_leak_test_b = local_4;
    iVar1 = pipe2(&local_10,0x80000);
    if (iVar1 == 0) {
      fd_leak_test_c = local_10;
      fd_leak_test_d = local_c;
      iVar1 = close(local_8);
      if (iVar1 == 0) {
        iVar1 = close(local_4);
        if (iVar1 == 0) {
          iVar1 = close(local_10);
          if (iVar1 == 0) {
            iVar1 = close(local_c);
            if (iVar1 == 0) {
              return;
            }
            pcVar2 = "close(fds_2[1]) == 0";
            uVar3 = 0x25;
          }
          else {
            pcVar2 = "close(fds_2[0]) == 0";
            uVar3 = 0x24;
          }
        }
        else {
          pcVar2 = "close(fds_1[1]) == 0";
          uVar3 = 0x23;
        }
      }
      else {
        pcVar2 = "close(fds_1[0]) == 0";
        uVar3 = 0x22;
      }
    }
    else {
      pcVar2 = "pipe2(fds_2, O_CLOEXEC) == 0";
      uVar3 = 0x1e;
    }
  }
  else {
    pcVar2 = "pipe2(fds_1, O_CLOEXEC) == 0";
    uVar3 = 0x18;
  }
  microatf_fail_require
            ("%s:%d: %s not met",
             "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/atf-c-leakcheck.h"
             ,uVar3,pcVar2);
}

Assistant:

static void
init_fd_checking(void)
{
	/* We check for fd leaks after each test. Remember fd numbers for
	 * checking here. */
	int fds_1[2];
	ATF_REQUIRE(pipe2(fds_1, O_CLOEXEC) == 0);

	fd_leak_test_a = fds_1[0];
	fd_leak_test_b = fds_1[1];

	int fds_2[2];
	ATF_REQUIRE(pipe2(fds_2, O_CLOEXEC) == 0);
	fd_leak_test_c = fds_2[0];
	fd_leak_test_d = fds_2[1];

	ATF_REQUIRE(close(fds_1[0]) == 0);
	ATF_REQUIRE(close(fds_1[1]) == 0);
	ATF_REQUIRE(close(fds_2[0]) == 0);
	ATF_REQUIRE(close(fds_2[1]) == 0);
}